

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

uhugeint_t
duckdb::BitwiseShiftLeftOperator::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t input,uhugeint_t shift)

{
  uhugeint_t value;
  uhugeint_t value_00;
  uhugeint_t value_01;
  uhugeint_t value_02;
  uhugeint_t value_03;
  bool bVar1;
  OutOfRangeException *pOVar2;
  uint64_t in_RCX;
  uint64_t in_RDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  uhugeint_t max_shift;
  uhugeint_t max_value;
  uhugeint_t local_168;
  string local_158;
  uhugeint_t local_138;
  uhugeint_t local_128;
  uhugeint_t local_110;
  uhugeint_t local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  uhugeint_t local_50;
  uhugeint_t local_40;
  uhugeint_t local_30;
  
  local_168.lower = in_RDX;
  local_168.upper = in_RCX;
  local_138.lower = in_RDI;
  local_138.upper = in_RSI;
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0x80);
  uhugeint_t::uhugeint_t(&local_100,1);
  local_110 = uhugeint_t::operator+((uhugeint_t *)&local_158,&local_100);
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
  bVar1 = uhugeint_t::operator<(&local_138,(uhugeint_t *)&local_158);
  if (bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Cannot left-shift negative number %s","");
    value_02.upper = local_138.upper;
    value_02.lower = local_138.lower;
    NumericHelper::ToString<duckdb::uhugeint_t>(&local_70,value_02);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_70);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
  bVar1 = uhugeint_t::operator<(&local_168,(uhugeint_t *)&local_158);
  if (!bVar1) {
    bVar1 = uhugeint_t::operator>=(&local_168,&local_110);
    if (bVar1) {
      uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
      bVar1 = uhugeint_t::operator==(&local_138,(uhugeint_t *)&local_158);
      if (!bVar1) {
        pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"Left-shift value %s is out of range","");
        value_00.upper = local_168.upper;
        value_00.lower = local_168.lower;
        NumericHelper::ToString<duckdb::uhugeint_t>(&local_b0,value_00);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_b0);
        __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uhugeint_t::uhugeint_t(&local_128,0);
    }
    else {
      uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
      bVar1 = uhugeint_t::operator==(&local_168,(uhugeint_t *)&local_158);
      if (bVar1) {
        local_128.upper = local_138.upper;
        local_128.lower = local_138.lower;
      }
      else {
        uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,1);
        local_40 = uhugeint_t::operator-(&local_110,&local_168);
        uhugeint_t::uhugeint_t(&local_50,1);
        local_30 = uhugeint_t::operator-(&local_40,&local_50);
        local_100 = uhugeint_t::operator<<((uhugeint_t *)&local_158,&local_30);
        bVar1 = uhugeint_t::operator>=(&local_138,&local_100);
        if (bVar1) {
          pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"Overflow in left shift (%s << %s)","");
          value_03.upper = local_138.upper;
          value_03.lower = local_138.lower;
          NumericHelper::ToString<duckdb::uhugeint_t>(&local_d0,value_03);
          value_01.upper = local_168.upper;
          value_01.lower = local_168.lower;
          NumericHelper::ToString<duckdb::uhugeint_t>(&local_f0,value_01);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar2,&local_158,&local_d0,&local_f0);
          __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_128 = uhugeint_t::operator<<(&local_138,&local_168);
      }
    }
    return local_128;
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"Cannot left-shift by negative number %s","");
  value.upper = local_168.upper;
  value.lower = local_168.lower;
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_90,value);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_90);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}